

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O0

TypeOpIntZext * __thiscall
TypeOpIntZext::getOperatorName_abi_cxx11_(TypeOpIntZext *this,PcodeOp *op)

{
  int4 iVar1;
  ostream *this_00;
  void *pvVar2;
  Varnode *pVVar3;
  PcodeOp *in_RDX;
  ostringstream local_198 [8];
  ostringstream s;
  PcodeOp *op_local;
  TypeOpIntZext *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  this_00 = std::operator<<((ostream *)local_198,(string *)&(op->start).uniq);
  pvVar2 = (void *)std::ostream::operator<<(this_00,std::dec);
  pVVar3 = PcodeOp::getIn(in_RDX,0);
  iVar1 = Varnode::getSize(pVVar3);
  pvVar2 = (void *)std::ostream::operator<<(pvVar2,iVar1);
  pVVar3 = PcodeOp::getOut(in_RDX);
  iVar1 = Varnode::getSize(pVVar3);
  std::ostream::operator<<(pvVar2,iVar1);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return this;
}

Assistant:

string TypeOpIntZext::getOperatorName(const PcodeOp *op) const

{
  ostringstream s;
  
  s << name << dec << op->getIn(0)->getSize() << op->getOut()->getSize();
  return s.str();
}